

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.hpp
# Opt level: O1

StructFilter * __thiscall duckdb::TableFilter::Cast<duckdb::StructFilter>(TableFilter *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->filter_type == STRUCT_EXTRACT) {
    return (StructFilter *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to cast to type - table filter type mismatch","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (filter_type != TARGET::TYPE) {
			throw InternalException("Failed to cast to type - table filter type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}